

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O1

bool __thiscall
libnbt::NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::equals(NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,NBTBase *tag)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  bVar1 = NBTBase::equals(&this->super_NBTBase,tag);
  if ((bVar1) && (__n = (this->_data)._M_string_length, __n == *(size_t *)&tag[1].type)) {
    if (__n == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp((this->_data)._M_dataplus._M_p,tag[1]._vptr_NBTBase,__n);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool equals(NBTBase &tag) override {
            if (NBTBase::equals(tag)) {
                return this->_data == ((NBTTagData<T> &) tag)._data;
            }
            return false;
        }